

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::GetActiveFunctions(ThreadContext *this,ActiveFunctionSet *pActiveFuncs)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *scriptContext;
  FunctionInfo *pFVar3;
  FunctionBody *this_00;
  FunctionBody *body;
  JavascriptFunction *local_c8;
  JavascriptFunction *function;
  JavascriptStackWalker walker;
  ActiveFunctionSet *pActiveFuncs_local;
  ThreadContext *this_local;
  
  walker.currentFrame.stackCheckCodeHeight = (size_t)pActiveFuncs;
  bVar1 = IsInScript(this);
  if ((bVar1) && (this->entryExitRecord != (ScriptEntryExitRecord *)0x0)) {
    scriptContext = GetScriptContextList(this);
    Js::JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)&function,scriptContext,true,(PVOID)0x0,true);
    local_c8 = (JavascriptFunction *)0x0;
    while (BVar2 = Js::JavascriptStackWalker::GetCallerWithoutInlinedFrames
                             ((JavascriptStackWalker *)&function,&local_c8), BVar2 != 0) {
      pFVar3 = Js::JavascriptFunction::GetFunctionInfo(local_c8);
      BVar2 = Js::FunctionInfo::HasBody(pFVar3);
      if (BVar2 != 0) {
        pFVar3 = Js::JavascriptFunction::GetFunctionInfo(local_c8);
        this_00 = Js::FunctionInfo::GetFunctionBody(pFVar3);
        Js::FunctionBody::UpdateActiveFunctionSet
                  (this_00,(ActiveFunctionSet *)walker.currentFrame.stackCheckCodeHeight,
                   (FunctionCodeGenRuntimeData *)0x0);
      }
    }
    Js::JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)&function);
  }
  return;
}

Assistant:

void
ThreadContext::GetActiveFunctions(ActiveFunctionSet * pActiveFuncs)
{
    if (!this->IsInScript() || this->entryExitRecord == nullptr)
    {
        return;
    }

    Js::JavascriptStackWalker walker(GetScriptContextList(), TRUE, NULL, true);
    Js::JavascriptFunction *function = nullptr;
    while (walker.GetCallerWithoutInlinedFrames(&function))
    {
        if (function->GetFunctionInfo()->HasBody())
        {
            Js::FunctionBody *body = function->GetFunctionInfo()->GetFunctionBody();
            body->UpdateActiveFunctionSet(pActiveFuncs, nullptr);
        }
    }
}